

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx::forward
          (DeconvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  int iVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  int iVar11;
  int *piVar12;
  undefined4 *puVar13;
  Layer *pLVar14;
  void *pvVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  bool bVar29;
  undefined1 auVar30 [32];
  size_t sVar31;
  Mat *pMVar32;
  undefined8 uVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  ulong uVar43;
  int iVar44;
  int iVar45;
  ulong uVar46;
  uint uVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  undefined1 (*pauVar51) [32];
  ulong uVar52;
  undefined1 (*pauVar53) [16];
  int iVar54;
  size_t sVar55;
  void *pvVar56;
  ulong uVar57;
  long lVar58;
  void *pvVar59;
  uint uVar60;
  uint _elempack;
  int x;
  ulong uVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar73;
  undefined1 auVar72 [64];
  undefined1 auVar84 [28];
  float fVar74;
  undefined1 auVar75 [16];
  float fVar89;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar113 [16];
  float fVar112;
  float fVar133;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar131;
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  float fVar143;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar144 [64];
  undefined1 auVar152 [16];
  float fVar156;
  undefined1 auVar153 [32];
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar154 [64];
  float fVar160;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar165 [32];
  ulong local_2b8;
  ulong local_288;
  float *local_260;
  void *local_230;
  Mat local_228;
  void *local_1e0;
  void *local_1d8;
  Mat *local_1d0;
  Option opt_p;
  Mat local_178;
  long local_130;
  long local_128;
  void *local_120;
  long local_118;
  void *local_110;
  Mat m_1;
  Mat m;
  Option opt_g;
  undefined8 uVar9;
  float fVar19;
  undefined1 auVar103 [32];
  undefined1 auVar106 [32];
  undefined1 auVar130 [32];
  
  iVar40 = bottom_blob->w;
  iVar48 = bottom_blob->h;
  uVar46 = bottom_blob->elemsize;
  iVar39 = bottom_blob->elempack;
  if (opt->use_packing_layout == true) {
    uVar60 = (this->super_DeconvolutionDepthWise).num_output;
    uVar47 = (uint)((uVar60 & 3) == 0) * 3 + 1;
    if ((uVar60 & 7) == 0) {
      uVar47 = 8;
    }
  }
  else {
    uVar47 = 1;
  }
  iVar49 = (this->super_DeconvolutionDepthWise).kernel_w;
  iVar54 = (this->super_DeconvolutionDepthWise).stride_w;
  iVar44 = ((this->super_DeconvolutionDepthWise).kernel_h + -1) *
           (this->super_DeconvolutionDepthWise).dilation_h;
  iVar34 = (this->super_DeconvolutionDepthWise).dilation_w;
  iVar35 = (this->super_DeconvolutionDepthWise).stride_h;
  iVar11 = (this->super_DeconvolutionDepthWise).output_pad_right;
  iVar45 = (this->super_DeconvolutionDepthWise).output_pad_bottom;
  uVar60 = bottom_blob->c;
  uVar43 = (ulong)uVar60;
  local_228.cstep = 0;
  local_228.data = (void *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  auVar91._0_4_ = (this->super_DeconvolutionDepthWise).pad_left;
  auVar91._4_4_ = (this->super_DeconvolutionDepthWise).pad_right;
  auVar91._8_4_ = (this->super_DeconvolutionDepthWise).pad_top;
  auVar91._12_4_ = (this->super_DeconvolutionDepthWise).pad_bottom;
  auVar91 = vpcmpgtd_avx(auVar91,(undefined1  [16])0x0);
  lVar58 = 0x10;
  if (((((auVar91 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        (auVar91 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar91 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar91[0xf]) &&
     ((((this->super_DeconvolutionDepthWise).output_w < 1 ||
       ((this->super_DeconvolutionDepthWise).output_h < 1)) && (lVar58 = 8, &local_228 != top_blob))
     )) {
    piVar12 = top_blob->refcount;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + 1;
      UNLOCK();
    }
    local_228.data = top_blob->data;
    local_228.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_228.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_228.elemsize = top_blob->elemsize;
    local_228.elempack = top_blob->elempack;
    local_228.allocator = top_blob->allocator;
    uVar6 = top_blob->dims;
    uVar7 = top_blob->w;
    uVar8 = top_blob->h;
    uVar10 = top_blob->d;
    uVar9 = CONCAT44(uVar10,uVar8);
    local_228.c = top_blob->c;
    local_228.cstep = top_blob->cstep;
    local_228.dims = uVar6;
    local_228.w = uVar7;
    local_228._48_8_ = uVar9;
  }
  iVar34 = (iVar49 + -1) * iVar34;
  iVar49 = iVar11 + (iVar40 + -1) * iVar54 + iVar34 + 1;
  iVar54 = iVar45 + (iVar48 + -1) * iVar35 + iVar44 + 1;
  sVar55 = (uVar46 / (ulong)(long)iVar39) * (ulong)uVar47;
  local_1d0 = top_blob;
  Mat::create(&local_228,iVar49,iVar54,(this->super_DeconvolutionDepthWise).num_output / (int)uVar47
              ,sVar55,uVar47,*(Allocator **)(&opt->lightmode + lVar58));
  if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
    iVar35 = (this->super_DeconvolutionDepthWise).num_output;
    iVar11 = (this->super_DeconvolutionDepthWise).group;
    if (iVar11 == iVar35 && iVar39 * uVar60 == iVar11) {
      iVar35 = (this->super_DeconvolutionDepthWise).kernel_h *
               (this->super_DeconvolutionDepthWise).kernel_w;
      if (iVar39 == 1) {
        if (iVar49 < 1) {
          iVar49 = 0;
        }
        uVar46 = 0;
        if (iVar54 < 1) {
          iVar54 = 0;
        }
        if ((int)uVar60 < 1) {
          uVar43 = 0;
        }
        local_110 = local_228.data;
        local_118 = local_228.cstep * local_228.elemsize;
        local_230 = (this->weight_data_tm).data;
        local_120 = bottom_blob->data;
        local_128 = bottom_blob->cstep * bottom_blob->elemsize;
        local_1d8 = (void *)((long)bottom_blob->w * bottom_blob->elemsize);
        local_130 = (long)iVar35 << 2;
        for (; pvVar56 = local_120, uVar46 != uVar43; uVar46 = uVar46 + 1) {
          local_260 = (float *)(local_118 * uVar46 + (long)local_110);
          lVar58 = local_128 * uVar46;
          for (iVar39 = 0; iVar39 != iVar54; iVar39 = iVar39 + 1) {
            uVar47 = (this->super_DeconvolutionDepthWise).kernel_h;
            iVar35 = (this->super_DeconvolutionDepthWise).bias_term;
            pvVar15 = (this->super_DeconvolutionDepthWise).bias_data.data;
            pfVar1 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
            if ((int)uVar47 < 1) {
              uVar47 = 0;
            }
            local_1e0 = (void *)(ulong)((this->super_DeconvolutionDepthWise).activation_type - 1);
            iVar11 = -iVar34;
            for (iVar45 = 0; iVar45 != iVar49; iVar45 = iVar45 + 1) {
              if (iVar35 == 0) {
                auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar72 = ZEXT464(*(uint *)((long)pvVar15 + uVar46 * 4));
              }
              iVar4 = (this->super_DeconvolutionDepthWise).stride_h;
              uVar60 = (this->super_DeconvolutionDepthWise).kernel_w;
              uVar52 = 0;
              if (0 < (int)uVar60) {
                uVar52 = (ulong)uVar60;
              }
              iVar50 = (this->super_DeconvolutionDepthWise).stride_w;
              pvVar59 = local_230;
              for (uVar57 = 0; uVar57 != uVar47; uVar57 = uVar57 + 1) {
                iVar41 = (this->super_DeconvolutionDepthWise).dilation_h * (int)uVar57 +
                         (iVar39 - iVar44);
                if ((-1 < iVar41) &&
                   (iVar42 = iVar41 / iVar4, iVar42 < iVar48 && iVar41 % iVar4 == 0)) {
                  iVar41 = iVar11;
                  for (uVar61 = 0; uVar52 != uVar61; uVar61 = uVar61 + 1) {
                    if ((-1 < iVar41) &&
                       (iVar36 = iVar41 / iVar50, iVar36 < iVar40 && iVar41 % iVar50 == 0)) {
                      auVar72 = ZEXT464((uint)(*(float *)((long)pvVar59 + uVar61 * 4) *
                                               *(float *)((long)pvVar56 +
                                                         (long)iVar36 * 4 +
                                                         (long)iVar42 * (long)local_1d8 + lVar58) +
                                              auVar72._0_4_));
                    }
                    iVar41 = iVar41 + (this->super_DeconvolutionDepthWise).dilation_w;
                  }
                }
                pvVar59 = (void *)((long)pvVar59 + (long)(int)uVar60 * 4);
              }
              auVar91 = auVar72._0_16_;
              fVar62 = auVar72._0_4_;
              fVar160 = fVar62;
              if ((uint)local_1e0 < 6) {
                switch((long)&switchD_003efac8::switchdataD_00540df0 +
                       (long)(int)(&switchD_003efac8::switchdataD_00540df0)[(long)local_1e0]) {
                case 0x3efaca:
                  auVar91 = vmaxss_avx(auVar91,ZEXT416(0));
                  fVar160 = auVar91._0_4_;
                  break;
                case 0x3efad7:
                  fVar160 = expf(fVar62);
                  fVar160 = logf(fVar160 + 1.0);
                  fVar160 = tanhf(fVar160);
                  fVar160 = fVar160 * fVar62;
                  break;
                case 0x3efb0c:
                  auVar91 = vmaxss_avx(auVar91,ZEXT416((uint)*pfVar1));
                  fVar160 = auVar91._0_4_;
                  if (pfVar1[1] < auVar91._0_4_) {
                    fVar160 = pfVar1[1];
                  }
                  break;
                case 0x3efb30:
                  auVar91 = vminss_avx(auVar91,ZEXT416(0x42b0c0a5));
                  auVar113._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                  auVar113._8_4_ = auVar91._8_4_ ^ 0x80000000;
                  auVar113._12_4_ = auVar91._12_4_ ^ 0x80000000;
                  auVar91 = vcmpss_avx(auVar91,ZEXT416(0xc2b0c0a5),1);
                  auVar82._8_4_ = 0x42b0c0a5;
                  auVar82._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar82._12_4_ = 0x42b0c0a5;
                  auVar91 = vblendvps_avx(auVar113,auVar82,auVar91);
                  fVar160 = expf(auVar91._0_4_);
                  fVar160 = 1.0 / (fVar160 + 1.0);
                  break;
                case 0x3efb80:
                  auVar91 = vcmpss_avx(ZEXT816(0) << 0x40,auVar91,1);
                  auVar83._8_4_ = 0x3f800000;
                  auVar83._0_8_ = 0x3f8000003f800000;
                  auVar83._12_4_ = 0x3f800000;
                  auVar91 = vblendvps_avx(ZEXT416((uint)*pfVar1),auVar83,auVar91);
                  fVar160 = auVar91._0_4_;
LAB_003efba4:
                  fVar160 = fVar160 * fVar62;
                  break;
                case 0x3efbaa:
                  fVar5 = *pfVar1;
                  fVar166 = -pfVar1[1] / fVar5;
                  fVar160 = 0.0;
                  if ((fVar166 <= fVar62) && (fVar160 = fVar62, fVar62 <= fVar166 + 1.0 / fVar5)) {
                    fVar160 = fVar5 * fVar62 + pfVar1[1];
                    goto LAB_003efba4;
                  }
                }
              }
              *local_260 = fVar160;
              local_260 = local_260 + 1;
              iVar11 = iVar11 + 1;
            }
          }
          local_230 = (void *)((long)local_230 + local_130);
        }
      }
      else if (iVar39 == 4) {
        if (iVar49 < 1) {
          iVar49 = 0;
        }
        if (iVar54 < 1) {
          iVar54 = 0;
        }
        if ((int)uVar60 < 1) {
          uVar43 = 0;
        }
        auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar140 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar110 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        iVar39 = 0;
        for (uVar46 = 0; uVar46 != uVar43; uVar46 = uVar46 + 1) {
          pauVar53 = (undefined1 (*) [16])
                     (local_228.cstep * uVar46 * local_228.elemsize + (long)local_228.data);
          iVar11 = bottom_blob->w;
          sVar55 = bottom_blob->elemsize;
          local_1d8 = (void *)(bottom_blob->cstep * uVar46 * sVar55 + (long)bottom_blob->data);
          local_1e0 = (void *)((long)iVar39 * 4 + (long)(this->weight_data_tm).data);
          for (iVar45 = 0; iVar45 != iVar54; iVar45 = iVar45 + 1) {
            iVar4 = -iVar34;
            for (iVar50 = 0; iVar50 != iVar49; iVar50 = iVar50 + 1) {
              if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                auVar141 = ZEXT1664((undefined1  [16])0x0);
              }
              else {
                auVar141 = ZEXT1664(*(undefined1 (*) [16])
                                     ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                                     uVar46 * 0x10));
              }
              iVar41 = (this->super_DeconvolutionDepthWise).stride_h;
              uVar47 = (this->super_DeconvolutionDepthWise).kernel_w;
              uVar60 = (this->super_DeconvolutionDepthWise).kernel_h;
              uVar52 = 0;
              if (0 < (int)uVar47) {
                uVar52 = (ulong)uVar47;
              }
              iVar42 = (this->super_DeconvolutionDepthWise).stride_w;
              if ((int)uVar60 < 1) {
                uVar60 = 0;
              }
              pvVar56 = local_1e0;
              for (uVar57 = 0; uVar57 != uVar60; uVar57 = uVar57 + 1) {
                iVar36 = (this->super_DeconvolutionDepthWise).dilation_h * (int)uVar57 +
                         (iVar45 - iVar44);
                if ((-1 < iVar36) &&
                   (iVar37 = iVar36 / iVar41, iVar37 < iVar48 && iVar36 % iVar41 == 0)) {
                  iVar36 = iVar4;
                  for (lVar58 = 0; uVar52 * 0x10 != lVar58; lVar58 = lVar58 + 0x10) {
                    if ((-1 < iVar36) &&
                       (iVar38 = iVar36 / iVar42, iVar38 < iVar40 && iVar36 % iVar42 == 0)) {
                      pfVar2 = (float *)((long)pvVar56 + lVar58);
                      pfVar1 = (float *)((long)local_1d8 +
                                        (long)(iVar38 << 2) * 4 +
                                        (long)iVar37 * (long)iVar11 * sVar55);
                      auVar141 = ZEXT1664(CONCAT412(pfVar2[3] * pfVar1[3] + auVar141._12_4_,
                                                    CONCAT48(pfVar2[2] * pfVar1[2] + auVar141._8_4_,
                                                             CONCAT44(pfVar2[1] * pfVar1[1] +
                                                                      auVar141._4_4_,
                                                                      *pfVar2 * *pfVar1 +
                                                                      auVar141._0_4_))));
                    }
                    iVar36 = iVar36 + (this->super_DeconvolutionDepthWise).dilation_w;
                  }
                }
                pvVar56 = (void *)((long)pvVar56 + (long)(int)uVar47 * 0x10);
              }
              iVar41 = (this->super_DeconvolutionDepthWise).activation_type;
              auVar91 = auVar141._0_16_;
              auVar123 = auVar91;
              if (5 < iVar41 - 1U) goto switchD_003ef3ea_caseD_1;
              auVar113 = auVar72._0_16_;
              auVar123 = vmaxps_avx(auVar91,auVar113);
              auVar82 = auVar110._0_16_;
              fVar62 = auVar140._4_4_;
              fVar166 = auVar140._8_4_;
              fVar167 = auVar140._12_4_;
              fVar169 = auVar140._0_4_;
              fVar160 = auVar110._0_4_;
              fVar5 = auVar110._4_4_;
              fVar16 = auVar110._8_4_;
              fVar17 = auVar110._12_4_;
              fVar168 = auVar141._8_4_;
              fVar73 = auVar141._12_4_;
              switch(iVar41) {
              case 2:
                auVar91 = vminps_avx(auVar91,auVar113);
                fVar160 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                auVar115._0_4_ = fVar160 * auVar91._0_4_ + auVar123._0_4_;
                auVar115._4_4_ = fVar160 * auVar91._4_4_ + auVar123._4_4_;
                auVar115._8_4_ = fVar160 * auVar91._8_4_ + auVar123._8_4_;
                auVar115._12_4_ = fVar160 * auVar91._12_4_ + auVar123._12_4_;
                auVar123 = auVar115;
                break;
              case 3:
                puVar13 = (undefined4 *)(this->super_DeconvolutionDepthWise).activation_params.data;
                uVar3 = *puVar13;
                auVar120._4_4_ = uVar3;
                auVar120._0_4_ = uVar3;
                auVar120._8_4_ = uVar3;
                auVar120._12_4_ = uVar3;
                uVar3 = puVar13[1];
                auVar163._4_4_ = uVar3;
                auVar163._0_4_ = uVar3;
                auVar163._8_4_ = uVar3;
                auVar163._12_4_ = uVar3;
                auVar91 = vmaxps_avx(auVar91,auVar120);
                auVar123 = vminps_avx(auVar163,auVar91);
                break;
              case 4:
                auVar70._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
                auVar70._8_4_ = -fVar168;
                auVar70._12_4_ = -fVar73;
                auVar79._8_4_ = 0x42b0c0a5;
                auVar79._0_8_ = 0x42b0c0a542b0c0a5;
                auVar79._12_4_ = 0x42b0c0a5;
                auVar91 = vminps_avx(auVar70,auVar79);
                auVar80._8_4_ = 0xc2b0c0a5;
                auVar80._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar80._12_4_ = 0xc2b0c0a5;
                auVar83 = vmaxps_avx(auVar91,auVar80);
                auVar121._0_4_ = fVar169 + auVar83._0_4_ * 1.442695;
                auVar121._4_4_ = fVar62 + auVar83._4_4_ * 1.442695;
                auVar121._8_4_ = fVar166 + auVar83._8_4_ * 1.442695;
                auVar121._12_4_ = fVar167 + auVar83._12_4_ * 1.442695;
                auVar164._0_4_ = (int)auVar121._0_4_;
                auVar164._4_4_ = (int)auVar121._4_4_;
                auVar164._8_4_ = (int)auVar121._8_4_;
                auVar164._12_4_ = (int)auVar121._12_4_;
                auVar113 = vcvtdq2ps_avx(auVar164);
                auVar91 = vcmpps_avx(auVar121,auVar113,1);
                auVar91 = vandps_avx(auVar91,auVar82);
                auVar91 = vsubps_avx(auVar113,auVar91);
                fVar168 = auVar91._0_4_ * -0.6931472 + auVar83._0_4_;
                fVar73 = auVar91._4_4_ * -0.6931472 + auVar83._4_4_;
                fVar74 = auVar91._8_4_ * -0.6931472 + auVar83._8_4_;
                fVar170 = auVar91._12_4_ * -0.6931472 + auVar83._12_4_;
                auVar122._0_4_ = (int)auVar91._0_4_;
                auVar122._4_4_ = (int)auVar91._4_4_;
                auVar122._8_4_ = (int)auVar91._8_4_;
                auVar122._12_4_ = (int)auVar91._12_4_;
                auVar91 = vpslld_avx(auVar122,0x17);
                auVar91 = vpaddd_avx(auVar91,auVar82);
                auVar71._0_4_ =
                     (fVar168 * fVar168 *
                      (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) *
                         fVar168 + 0.041665796) * fVar168 + 0.16666666) * fVar168 + fVar169) +
                     fVar168 + fVar160) * auVar91._0_4_ + fVar160;
                auVar71._4_4_ =
                     (fVar73 * fVar73 *
                      (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) * fVar73 +
                        0.041665796) * fVar73 + 0.16666666) * fVar73 + fVar62) + fVar73 + fVar5) *
                     auVar91._4_4_ + fVar5;
                auVar71._8_4_ =
                     (fVar74 * fVar74 *
                      (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                        0.041665796) * fVar74 + 0.16666666) * fVar74 + fVar166) + fVar74 + fVar16) *
                     auVar91._8_4_ + fVar16;
                auVar71._12_4_ =
                     (fVar170 * fVar170 *
                      (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) *
                         fVar170 + 0.041665796) * fVar170 + 0.16666666) * fVar170 + fVar167) +
                     fVar170 + fVar17) * auVar91._12_4_ + fVar17;
                auVar123 = vdivps_avx(auVar82,auVar71);
                break;
              case 5:
                auVar108._8_4_ = 0x42b0c0a5;
                auVar108._0_8_ = 0x42b0c0a542b0c0a5;
                auVar108._12_4_ = 0x42b0c0a5;
                auVar91 = vminps_avx(auVar91,auVar108);
                auVar138._8_4_ = 0xc2b0c0a5;
                auVar138._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar138._12_4_ = 0xc2b0c0a5;
                auVar83 = vmaxps_avx(auVar138,auVar91);
                auVar152._0_4_ = auVar83._0_4_ * 1.442695 + fVar169;
                auVar152._4_4_ = auVar83._4_4_ * 1.442695 + fVar62;
                auVar152._8_4_ = auVar83._8_4_ * 1.442695 + fVar166;
                auVar152._12_4_ = auVar83._12_4_ * 1.442695 + fVar167;
                auVar161._0_4_ = (int)auVar152._0_4_;
                auVar161._4_4_ = (int)auVar152._4_4_;
                auVar161._8_4_ = (int)auVar152._8_4_;
                auVar161._12_4_ = (int)auVar152._12_4_;
                auVar113 = vcvtdq2ps_avx(auVar161);
                auVar91 = vcmpps_avx(auVar152,auVar113,1);
                auVar91 = vandps_avx(auVar91,auVar82);
                auVar91 = vsubps_avx(auVar113,auVar91);
                auVar162._0_4_ = auVar91._0_4_ * 0.6931472;
                auVar162._4_4_ = auVar91._4_4_ * 0.6931472;
                auVar162._8_4_ = auVar91._8_4_ * 0.6931472;
                auVar162._12_4_ = auVar91._12_4_ * 0.6931472;
                auVar113 = vsubps_avx(auVar83,auVar162);
                fVar74 = auVar113._0_4_;
                fVar170 = auVar113._4_4_;
                fVar171 = auVar113._8_4_;
                fVar89 = auVar113._12_4_;
                auVar116._0_4_ = (int)auVar91._0_4_;
                auVar116._4_4_ = (int)auVar91._4_4_;
                auVar116._8_4_ = (int)auVar91._8_4_;
                auVar116._12_4_ = (int)auVar91._12_4_;
                auVar91 = vpslld_avx(auVar116,0x17);
                auVar91 = vpaddd_avx(auVar91,auVar82);
                auVar117._0_4_ =
                     (fVar74 + fVar160 +
                     fVar74 * fVar74 *
                     (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                       0.041665796) * fVar74 + 0.16666666) * fVar74 + fVar169)) * auVar91._0_4_ +
                     fVar160;
                auVar117._4_4_ =
                     (fVar170 + fVar5 +
                     fVar170 * fVar170 *
                     (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170
                       + 0.041665796) * fVar170 + 0.16666666) * fVar170 + fVar62)) * auVar91._4_4_ +
                     fVar5;
                auVar117._8_4_ =
                     (fVar171 + fVar16 +
                     fVar171 * fVar171 *
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + fVar166)) * auVar91._8_4_
                     + fVar16;
                auVar117._12_4_ =
                     (fVar89 + fVar17 +
                     fVar89 * fVar89 *
                     (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                       0.041665796) * fVar89 + 0.16666666) * fVar89 + fVar167)) * auVar91._12_4_ +
                     fVar17;
                auVar75._8_4_ = 0x800000;
                auVar75._0_8_ = 0x80000000800000;
                auVar75._12_4_ = 0x800000;
                auVar91 = vmaxps_avx(auVar117,auVar75);
                auVar113 = vpsrld_avx(auVar91,0x17);
                auVar94._8_4_ = 0xffffff82;
                auVar94._0_8_ = 0xffffff82ffffff82;
                auVar94._12_4_ = 0xffffff82;
                auVar113 = vpaddd_avx(auVar113,auVar94);
                auVar95._8_4_ = 0x807fffff;
                auVar95._0_8_ = 0x807fffff807fffff;
                auVar95._12_4_ = 0x807fffff;
                auVar91 = vandps_avx(auVar91,auVar95);
                auVar123 = vorps_avx(auVar91,auVar140._0_16_);
                auVar83 = vcvtdq2ps_avx(auVar113);
                auVar96._8_4_ = 0x3f3504f3;
                auVar96._0_8_ = 0x3f3504f33f3504f3;
                auVar96._12_4_ = 0x3f3504f3;
                auVar113 = vcmpps_avx(auVar123,auVar96,1);
                auVar91 = vandps_avx(auVar113,auVar123);
                fVar74 = auVar123._0_4_ + -1.0 + auVar91._0_4_;
                fVar170 = auVar123._4_4_ + -1.0 + auVar91._4_4_;
                fVar171 = auVar123._8_4_ + -1.0 + auVar91._8_4_;
                fVar89 = auVar123._12_4_ + -1.0 + auVar91._12_4_;
                auVar91 = vandps_avx(auVar113,auVar82);
                auVar113 = vsubps_avx(auVar83,auVar91);
                auVar91 = vcmpps_avx(auVar117,_DAT_00536030,2);
                auVar76._0_4_ =
                     (fVar74 * fVar74 *
                      (((((((((fVar74 * 0.070376836 + -0.1151461) * fVar74 + 0.116769984) * fVar74 +
                            -0.12420141) * fVar74 + 0.14249323) * fVar74 + -0.16668057) * fVar74 +
                         0.20000714) * fVar74 + -0.24999994) * fVar74 + 0.3333333) * fVar74 + -0.5)
                     + auVar113._0_4_ * 0.6931472 + fVar74) * -2.0;
                auVar76._4_4_ =
                     (fVar170 * fVar170 *
                      (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) *
                             fVar170 + -0.12420141) * fVar170 + 0.14249323) * fVar170 + -0.16668057)
                          * fVar170 + 0.20000714) * fVar170 + -0.24999994) * fVar170 + 0.3333333) *
                       fVar170 + -0.5) + auVar113._4_4_ * 0.6931472 + fVar170) * -2.0;
                auVar76._8_4_ =
                     (fVar171 * fVar171 *
                      (((((((((fVar171 * 0.070376836 + -0.1151461) * fVar171 + 0.116769984) *
                             fVar171 + -0.12420141) * fVar171 + 0.14249323) * fVar171 + -0.16668057)
                          * fVar171 + 0.20000714) * fVar171 + -0.24999994) * fVar171 + 0.3333333) *
                       fVar171 + -0.5) + auVar113._8_4_ * 0.6931472 + fVar171) * -2.0;
                auVar76._12_4_ =
                     (fVar89 * fVar89 *
                      (((((((((fVar89 * 0.070376836 + -0.1151461) * fVar89 + 0.116769984) * fVar89 +
                            -0.12420141) * fVar89 + 0.14249323) * fVar89 + -0.16668057) * fVar89 +
                         0.20000714) * fVar89 + -0.24999994) * fVar89 + 0.3333333) * fVar89 + -0.5)
                     + auVar113._12_4_ * 0.6931472 + fVar89) * -2.0;
                auVar97._8_4_ = 0x7fffffff;
                auVar97._0_8_ = 0x7fffffff7fffffff;
                auVar97._12_4_ = 0x7fffffff;
                auVar91 = vblendvps_avx(auVar76,auVar97,auVar91);
                auVar98._8_4_ = 0x42b0c0a5;
                auVar98._0_8_ = 0x42b0c0a542b0c0a5;
                auVar98._12_4_ = 0x42b0c0a5;
                auVar91 = vminps_avx(auVar91,auVar98);
                auVar99._8_4_ = 0xc2b0c0a5;
                auVar99._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar99._12_4_ = 0xc2b0c0a5;
                auVar83 = vmaxps_avx(auVar91,auVar99);
                auVar100._0_4_ = auVar83._0_4_ * 1.442695 + fVar169;
                auVar100._4_4_ = auVar83._4_4_ * 1.442695 + fVar62;
                auVar100._8_4_ = auVar83._8_4_ * 1.442695 + fVar166;
                auVar100._12_4_ = auVar83._12_4_ * 1.442695 + fVar167;
                auVar118._0_4_ = (int)auVar100._0_4_;
                auVar118._4_4_ = (int)auVar100._4_4_;
                auVar118._8_4_ = (int)auVar100._8_4_;
                auVar118._12_4_ = (int)auVar100._12_4_;
                auVar113 = vcvtdq2ps_avx(auVar118);
                auVar91 = vcmpps_avx(auVar100,auVar113,1);
                auVar91 = vandps_avx(auVar91,auVar82);
                auVar91 = vsubps_avx(auVar113,auVar91);
                auVar119._0_4_ = auVar91._0_4_ * 0.6931472;
                auVar119._4_4_ = auVar91._4_4_ * 0.6931472;
                auVar119._8_4_ = auVar91._8_4_ * 0.6931472;
                auVar119._12_4_ = auVar91._12_4_ * 0.6931472;
                auVar110 = ZEXT1664(auVar82);
                auVar113 = vsubps_avx(auVar83,auVar119);
                fVar74 = auVar113._0_4_;
                fVar170 = auVar113._4_4_;
                fVar171 = auVar113._8_4_;
                fVar89 = auVar113._12_4_;
                auVar72 = ZEXT864(0) << 0x20;
                auVar140 = ZEXT1664(auVar140._0_16_);
                auVar101._0_4_ = (int)auVar91._0_4_;
                auVar101._4_4_ = (int)auVar91._4_4_;
                auVar101._8_4_ = (int)auVar91._8_4_;
                auVar101._12_4_ = (int)auVar91._12_4_;
                auVar91 = vpslld_avx(auVar101,0x17);
                auVar91 = vpaddd_avx(auVar91,auVar82);
                auVar77._0_4_ =
                     (fVar74 + fVar160 +
                     (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                       0.041665796) * fVar74 + 0.16666666) * fVar74 + fVar169) * fVar74 * fVar74) *
                     auVar91._0_4_ + fVar160;
                auVar77._4_4_ =
                     (fVar170 + fVar5 +
                     (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170
                       + 0.041665796) * fVar170 + 0.16666666) * fVar170 + fVar62) *
                     fVar170 * fVar170) * auVar91._4_4_ + fVar5;
                auVar77._8_4_ =
                     (fVar171 + fVar16 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + fVar166) *
                     fVar171 * fVar171) * auVar91._8_4_ + fVar16;
                auVar77._12_4_ =
                     (fVar89 + fVar17 +
                     (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                       0.041665796) * fVar89 + 0.16666666) * fVar89 + fVar167) * fVar89 * fVar89) *
                     auVar91._12_4_ + fVar17;
                auVar102._8_4_ = 0x40000000;
                auVar102._0_8_ = 0x4000000040000000;
                auVar102._12_4_ = 0x40000000;
                auVar91 = vdivps_avx(auVar102,auVar77);
                auVar78._0_4_ = auVar91._0_4_ + -1.0;
                auVar78._4_4_ = auVar91._4_4_ + -1.0;
                auVar78._8_4_ = auVar91._8_4_ + -1.0;
                auVar78._12_4_ = auVar91._12_4_ + -1.0;
                goto LAB_003ef7e1;
              case 6:
                pfVar1 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                fVar160 = *pfVar1;
                fVar62 = pfVar1[1];
                auVar81._0_4_ = fVar160 * auVar141._0_4_ + fVar62;
                auVar81._4_4_ = fVar160 * auVar141._4_4_ + fVar62;
                auVar81._8_4_ = fVar160 * fVar168 + fVar62;
                auVar81._12_4_ = fVar160 * fVar73 + fVar62;
                auVar91 = vmaxps_avx(auVar81,auVar113);
                auVar78 = vminps_avx(auVar91,auVar82);
LAB_003ef7e1:
                auVar123._0_4_ = auVar78._0_4_ * auVar141._0_4_;
                auVar123._4_4_ = auVar78._4_4_ * auVar141._4_4_;
                auVar123._8_4_ = auVar78._8_4_ * fVar168;
                auVar123._12_4_ = auVar78._12_4_ * fVar73;
              }
switchD_003ef3ea_caseD_1:
              *pauVar53 = auVar123;
              pauVar53 = pauVar53 + 1;
              iVar4 = iVar4 + 1;
            }
          }
          iVar39 = iVar39 + iVar35 * 4;
        }
      }
      else if (iVar39 == 8) {
        if (iVar49 < 1) {
          iVar49 = 0;
        }
        if (iVar54 < 1) {
          iVar54 = 0;
        }
        if ((int)uVar60 < 1) {
          uVar43 = 0;
        }
        auVar140 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar141 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar142 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar72 = ZEXT3264(CONCAT428(0x3f000000,
                                     CONCAT424(0x3f000000,
                                               CONCAT420(0x3f000000,
                                                         CONCAT416(0x3f000000,
                                                                   CONCAT412(0x3f000000,
                                                                             CONCAT48(0x3f000000,
                                                                                                                                                                            
                                                  0x3f0000003f000000)))))));
        auVar110 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar144 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        iVar39 = 0;
        for (uVar46 = 0; uVar46 != uVar43; uVar46 = uVar46 + 1) {
          pauVar51 = (undefined1 (*) [32])
                     (local_228.cstep * uVar46 * local_228.elemsize + (long)local_228.data);
          iVar11 = bottom_blob->w;
          sVar55 = bottom_blob->elemsize;
          local_1d8 = (void *)(bottom_blob->cstep * uVar46 * sVar55 + (long)bottom_blob->data);
          local_1e0 = (void *)((long)iVar39 * 4 + (long)(this->weight_data_tm).data);
          for (iVar45 = 0; iVar45 != iVar54; iVar45 = iVar45 + 1) {
            iVar4 = -iVar34;
            for (iVar50 = 0; iVar50 != iVar49; iVar50 = iVar50 + 1) {
              if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                auVar154 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar154 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                                     uVar46 * 0x20));
              }
              iVar41 = (this->super_DeconvolutionDepthWise).stride_h;
              uVar47 = (this->super_DeconvolutionDepthWise).kernel_w;
              uVar60 = (this->super_DeconvolutionDepthWise).kernel_h;
              uVar52 = 0;
              if (0 < (int)uVar47) {
                uVar52 = (ulong)uVar47;
              }
              iVar42 = (this->super_DeconvolutionDepthWise).stride_w;
              if ((int)uVar60 < 1) {
                uVar60 = 0;
              }
              pvVar56 = local_1e0;
              for (uVar57 = 0; uVar57 != uVar60; uVar57 = uVar57 + 1) {
                iVar36 = (this->super_DeconvolutionDepthWise).dilation_h * (int)uVar57 +
                         (iVar45 - iVar44);
                if ((-1 < iVar36) &&
                   (iVar37 = iVar36 / iVar41, iVar37 < iVar48 && iVar36 % iVar41 == 0)) {
                  iVar36 = iVar4;
                  for (lVar58 = 0; uVar52 * 0x20 != lVar58; lVar58 = lVar58 + 0x20) {
                    if ((-1 < iVar36) &&
                       (iVar38 = iVar36 / iVar42, iVar38 < iVar40 && iVar36 % iVar42 == 0)) {
                      pfVar1 = (float *)((long)pvVar56 + lVar58);
                      pfVar2 = (float *)((long)local_1d8 +
                                        (long)(iVar38 << 3) * 4 +
                                        (long)iVar37 * (long)iVar11 * sVar55);
                      auVar154 = ZEXT3264(CONCAT428(auVar154._28_4_ + pfVar1[7],
                                                    CONCAT424(auVar154._24_4_ +
                                                              pfVar1[6] * pfVar2[6],
                                                              CONCAT420(auVar154._20_4_ +
                                                                        pfVar1[5] * pfVar2[5],
                                                                        CONCAT416(auVar154._16_4_ +
                                                                                  pfVar1[4] *
                                                                                  pfVar2[4],
                                                                                  CONCAT412(auVar154
                                                  ._12_4_ + pfVar1[3] * pfVar2[3],
                                                  CONCAT48(auVar154._8_4_ + pfVar1[2] * pfVar2[2],
                                                           CONCAT44(auVar154._4_4_ +
                                                                    pfVar1[1] * pfVar2[1],
                                                                    auVar154._0_4_ +
                                                                    *pfVar1 * *pfVar2))))))));
                    }
                    iVar36 = iVar36 + (this->super_DeconvolutionDepthWise).dilation_w;
                  }
                }
                pvVar56 = (void *)((long)pvVar56 + (long)(int)uVar47 * 0x20);
              }
              iVar41 = (this->super_DeconvolutionDepthWise).activation_type;
              auVar88 = auVar154._0_32_;
              auVar127 = auVar88;
              if (5 < iVar41 - 1U) goto switchD_003ee7d7_caseD_1;
              auVar65 = auVar140._0_32_;
              auVar127 = vmaxps_avx(auVar88,auVar65);
              fVar155 = auVar154._8_4_;
              fVar156 = auVar154._12_4_;
              fVar157 = auVar154._16_4_;
              fVar158 = auVar154._20_4_;
              fVar159 = auVar154._24_4_;
              fVar112 = auVar142._0_4_;
              fVar131 = auVar142._4_4_;
              fVar132 = auVar142._8_4_;
              fVar133 = auVar142._12_4_;
              fVar134 = auVar142._16_4_;
              fVar135 = auVar142._20_4_;
              fVar136 = auVar142._24_4_;
              auVar109 = auVar110._0_32_;
              fVar143 = auVar144._0_4_;
              fVar145 = auVar144._4_4_;
              fVar146 = auVar144._8_4_;
              fVar147 = auVar144._12_4_;
              fVar148 = auVar144._16_4_;
              fVar149 = auVar144._20_4_;
              fVar150 = auVar144._24_4_;
              fVar151 = auVar144._28_4_;
              auVar107 = auVar141._0_32_;
              fVar62 = auVar72._0_4_;
              fVar5 = auVar72._4_4_;
              fVar16 = auVar72._8_4_;
              fVar17 = auVar72._12_4_;
              fVar73 = auVar72._16_4_;
              fVar74 = auVar72._20_4_;
              fVar89 = auVar72._24_4_;
              fVar18 = auVar72._28_4_;
              fVar160 = auVar110._0_4_;
              fVar166 = auVar110._4_4_;
              fVar167 = auVar110._8_4_;
              fVar168 = auVar110._12_4_;
              fVar169 = auVar110._16_4_;
              fVar170 = auVar110._20_4_;
              fVar171 = auVar110._24_4_;
              fVar19 = auVar110._28_4_;
              switch(iVar41) {
              case 2:
                auVar88 = vminps_avx(auVar88,auVar65);
                fVar160 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                auVar124._0_4_ = fVar160 * auVar88._0_4_ + auVar127._0_4_;
                auVar124._4_4_ = fVar160 * auVar88._4_4_ + auVar127._4_4_;
                auVar124._8_4_ = fVar160 * auVar88._8_4_ + auVar127._8_4_;
                auVar124._12_4_ = fVar160 * auVar88._12_4_ + auVar127._12_4_;
                auVar124._16_4_ = fVar160 * auVar88._16_4_ + auVar127._16_4_;
                auVar124._20_4_ = fVar160 * auVar88._20_4_ + auVar127._20_4_;
                auVar124._24_4_ = fVar160 * auVar88._24_4_ + auVar127._24_4_;
                auVar124._28_4_ = auVar88._28_4_ + auVar127._28_4_;
                auVar127 = auVar124;
                break;
              case 3:
                puVar13 = (undefined4 *)(this->super_DeconvolutionDepthWise).activation_params.data;
                uVar3 = *puVar13;
                auVar128._4_4_ = uVar3;
                auVar128._0_4_ = uVar3;
                auVar128._8_4_ = uVar3;
                auVar128._12_4_ = uVar3;
                auVar128._16_4_ = uVar3;
                auVar128._20_4_ = uVar3;
                auVar128._24_4_ = uVar3;
                auVar128._28_4_ = uVar3;
                uVar3 = puVar13[1];
                auVar165._4_4_ = uVar3;
                auVar165._0_4_ = uVar3;
                auVar165._8_4_ = uVar3;
                auVar165._12_4_ = uVar3;
                auVar165._16_4_ = uVar3;
                auVar165._20_4_ = uVar3;
                auVar165._24_4_ = uVar3;
                auVar165._28_4_ = uVar3;
                auVar127 = vmaxps_avx(auVar88,auVar128);
                auVar127 = vminps_avx(auVar165,auVar127);
                break;
              case 4:
                auVar129._0_8_ = auVar154._0_8_ ^ 0x8000000080000000;
                auVar129._8_4_ = -fVar155;
                auVar129._12_4_ = -fVar156;
                auVar129._16_4_ = -fVar157;
                auVar129._20_4_ = -fVar158;
                auVar129._24_4_ = -fVar159;
                auVar129._28_4_ = -auVar154._28_4_;
                auVar69._8_4_ = 0x42b0c0a5;
                auVar69._0_8_ = 0x42b0c0a542b0c0a5;
                auVar69._12_4_ = 0x42b0c0a5;
                auVar69._16_4_ = 0x42b0c0a5;
                auVar69._20_4_ = 0x42b0c0a5;
                auVar69._24_4_ = 0x42b0c0a5;
                auVar69._28_4_ = 0x42b0c0a5;
                auVar127 = vminps_avx(auVar129,auVar69);
                auVar88 = vmaxps_avx(auVar107,auVar127);
                auVar153._0_4_ = fVar112 * auVar88._0_4_ + fVar62;
                auVar153._4_4_ = fVar131 * auVar88._4_4_ + fVar5;
                auVar153._8_4_ = fVar132 * auVar88._8_4_ + fVar16;
                auVar153._12_4_ = fVar133 * auVar88._12_4_ + fVar17;
                auVar153._16_4_ = fVar134 * auVar88._16_4_ + fVar73;
                auVar153._20_4_ = fVar135 * auVar88._20_4_ + fVar74;
                auVar153._24_4_ = fVar136 * auVar88._24_4_ + fVar89;
                auVar153._28_4_ = auVar154._28_4_ + fVar18;
                auVar65 = vroundps_avx(auVar153,1);
                auVar127 = vcmpps_avx(auVar153,auVar65,1);
                auVar127 = vandps_avx(auVar127,auVar109);
                auVar127 = vsubps_avx(auVar65,auVar127);
                fVar112 = auVar127._0_4_ * -0.6931472 + auVar88._0_4_;
                fVar131 = auVar127._4_4_ * -0.6931472 + auVar88._4_4_;
                fVar132 = auVar127._8_4_ * -0.6931472 + auVar88._8_4_;
                fVar133 = auVar127._12_4_ * -0.6931472 + auVar88._12_4_;
                fVar134 = auVar127._16_4_ * -0.6931472 + auVar88._16_4_;
                fVar135 = auVar127._20_4_ * -0.6931472 + auVar88._20_4_;
                fVar136 = auVar127._24_4_ * -0.6931472 + auVar88._24_4_;
                auVar114._0_4_ = (int)auVar127._0_4_;
                auVar114._4_4_ = (int)auVar127._4_4_;
                auVar114._8_4_ = (int)auVar127._8_4_;
                auVar114._12_4_ = (int)auVar127._12_4_;
                auVar130._16_4_ = (int)auVar127._16_4_;
                auVar130._0_16_ = auVar114;
                auVar130._20_4_ = (int)auVar127._20_4_;
                auVar130._24_4_ = (int)auVar127._24_4_;
                auVar130._28_4_ = (int)auVar127._28_4_;
                auVar113 = vpslld_avx(auVar114,0x17);
                auVar91 = vpslld_avx(auVar130._16_16_,0x17);
                auVar93._8_4_ = 0x3f800000;
                auVar93._0_8_ = 0x3f8000003f800000;
                auVar93._12_4_ = 0x3f800000;
                in_ZMM3 = ZEXT1664(auVar93);
                auVar91 = vpaddd_avx(auVar91,auVar93);
                auVar113 = vpaddd_avx(auVar113,auVar93);
                auVar87._0_4_ =
                     (fVar112 + fVar160 +
                     fVar112 * fVar112 *
                     ((((fVar143 + (fVar112 * 0.00019875691 + 0.0013981999) * fVar112) * fVar112 +
                       0.041665796) * fVar112 + 0.16666666) * fVar112 + fVar62)) * auVar113._0_4_ +
                     fVar160;
                auVar87._4_4_ =
                     (fVar131 + fVar166 +
                     fVar131 * fVar131 *
                     ((((fVar145 + (fVar131 * 0.00019875691 + 0.0013981999) * fVar131) * fVar131 +
                       0.041665796) * fVar131 + 0.16666666) * fVar131 + fVar5)) * auVar113._4_4_ +
                     fVar166;
                auVar87._8_4_ =
                     (fVar132 + fVar167 +
                     fVar132 * fVar132 *
                     ((((fVar146 + (fVar132 * 0.00019875691 + 0.0013981999) * fVar132) * fVar132 +
                       0.041665796) * fVar132 + 0.16666666) * fVar132 + fVar16)) * auVar113._8_4_ +
                     fVar167;
                auVar87._12_4_ =
                     (fVar133 + fVar168 +
                     fVar133 * fVar133 *
                     ((((fVar147 + (fVar133 * 0.00019875691 + 0.0013981999) * fVar133) * fVar133 +
                       0.041665796) * fVar133 + 0.16666666) * fVar133 + fVar17)) * auVar113._12_4_ +
                     fVar168;
                auVar87._16_4_ =
                     (fVar134 + fVar169 +
                     fVar134 * fVar134 *
                     ((((fVar148 + (fVar134 * 0.00019875691 + 0.0013981999) * fVar134) * fVar134 +
                       0.041665796) * fVar134 + 0.16666666) * fVar134 + fVar73)) * auVar91._0_4_ +
                     fVar169;
                auVar87._20_4_ =
                     (fVar135 + fVar170 +
                     fVar135 * fVar135 *
                     ((((fVar149 + (fVar135 * 0.00019875691 + 0.0013981999) * fVar135) * fVar135 +
                       0.041665796) * fVar135 + 0.16666666) * fVar135 + fVar74)) * auVar91._4_4_ +
                     fVar170;
                auVar87._24_4_ =
                     (fVar136 + fVar171 +
                     fVar136 * fVar136 *
                     ((((fVar150 + (fVar136 * 0.00019875691 + 0.0013981999) * fVar136) * fVar136 +
                       0.041665796) * fVar136 + 0.16666666) * fVar136 + fVar89)) * auVar91._8_4_ +
                     fVar171;
                auVar87._28_4_ =
                     auVar65._28_4_ + auVar88._28_4_ + fVar19 +
                     fVar151 + -0.691749 + 0.041665796 + 0.16666666 + fVar18 + fVar19;
                auVar127 = vdivps_avx(auVar109,auVar87);
                break;
              case 5:
                auVar139._8_4_ = 0x42b0c0a5;
                auVar139._0_8_ = 0x42b0c0a542b0c0a5;
                auVar139._12_4_ = 0x42b0c0a5;
                auVar139._16_4_ = 0x42b0c0a5;
                auVar139._20_4_ = 0x42b0c0a5;
                auVar139._24_4_ = 0x42b0c0a5;
                auVar139._28_4_ = 0x42b0c0a5;
                auVar88 = vminps_avx(auVar88,auVar139);
                auVar88 = vmaxps_avx(auVar107,auVar88);
                auVar125._0_4_ = fVar112 * auVar88._0_4_ + fVar62;
                auVar125._4_4_ = fVar131 * auVar88._4_4_ + fVar5;
                auVar125._8_4_ = fVar132 * auVar88._8_4_ + fVar16;
                auVar125._12_4_ = fVar133 * auVar88._12_4_ + fVar17;
                auVar125._16_4_ = fVar134 * auVar88._16_4_ + fVar73;
                auVar125._20_4_ = fVar135 * auVar88._20_4_ + fVar74;
                auVar125._24_4_ = fVar136 * auVar88._24_4_ + fVar89;
                auVar125._28_4_ = auVar127._28_4_ + fVar18;
                auVar65 = vroundps_avx(auVar125,1);
                auVar127 = vcmpps_avx(auVar125,auVar65,1);
                auVar127 = vandps_avx(auVar127,auVar109);
                auVar127 = vsubps_avx(auVar65,auVar127);
                auVar109._4_4_ = auVar127._4_4_ * 0.6931472;
                auVar109._0_4_ = auVar127._0_4_ * 0.6931472;
                auVar109._8_4_ = auVar127._8_4_ * 0.6931472;
                auVar109._12_4_ = auVar127._12_4_ * 0.6931472;
                auVar109._16_4_ = auVar127._16_4_ * 0.6931472;
                auVar109._20_4_ = auVar127._20_4_ * 0.6931472;
                auVar109._24_4_ = auVar127._24_4_ * 0.6931472;
                auVar109._28_4_ = auVar65._28_4_;
                auVar88 = vsubps_avx(auVar88,auVar109);
                fVar20 = auVar88._0_4_;
                fVar21 = auVar88._4_4_;
                fVar22 = auVar88._8_4_;
                fVar23 = auVar88._12_4_;
                fVar24 = auVar88._16_4_;
                fVar25 = auVar88._20_4_;
                fVar26 = auVar88._24_4_;
                auVar90._0_4_ = (int)auVar127._0_4_;
                auVar90._4_4_ = (int)auVar127._4_4_;
                auVar90._8_4_ = (int)auVar127._8_4_;
                auVar90._12_4_ = (int)auVar127._12_4_;
                auVar103._16_4_ = (int)auVar127._16_4_;
                auVar103._0_16_ = auVar90;
                auVar103._20_4_ = (int)auVar127._20_4_;
                auVar103._24_4_ = (int)auVar127._24_4_;
                auVar103._28_4_ = (int)auVar127._28_4_;
                auVar113 = vpslld_avx(auVar90,0x17);
                auVar91 = vpslld_avx(auVar103._16_16_,0x17);
                auVar63._8_4_ = 0x3f800000;
                auVar63._0_8_ = 0x3f8000003f800000;
                auVar63._12_4_ = 0x3f800000;
                auVar91 = vpaddd_avx(auVar91,auVar63);
                auVar113 = vpaddd_avx(auVar113,auVar63);
                auVar126._0_4_ =
                     (fVar20 + fVar160 +
                     fVar20 * fVar20 *
                     ((((fVar143 + (fVar20 * 0.00019875691 + 0.0013981999) * fVar20) * fVar20 +
                       0.041665796) * fVar20 + 0.16666666) * fVar20 + fVar62)) * auVar113._0_4_ +
                     fVar160;
                auVar126._4_4_ =
                     (fVar21 + fVar166 +
                     fVar21 * fVar21 *
                     ((((fVar145 + (fVar21 * 0.00019875691 + 0.0013981999) * fVar21) * fVar21 +
                       0.041665796) * fVar21 + 0.16666666) * fVar21 + fVar5)) * auVar113._4_4_ +
                     fVar166;
                auVar126._8_4_ =
                     (fVar22 + fVar167 +
                     fVar22 * fVar22 *
                     ((((fVar146 + (fVar22 * 0.00019875691 + 0.0013981999) * fVar22) * fVar22 +
                       0.041665796) * fVar22 + 0.16666666) * fVar22 + fVar16)) * auVar113._8_4_ +
                     fVar167;
                auVar126._12_4_ =
                     (fVar23 + fVar168 +
                     fVar23 * fVar23 *
                     ((((fVar147 + (fVar23 * 0.00019875691 + 0.0013981999) * fVar23) * fVar23 +
                       0.041665796) * fVar23 + 0.16666666) * fVar23 + fVar17)) * auVar113._12_4_ +
                     fVar168;
                auVar126._16_4_ =
                     (fVar24 + fVar169 +
                     fVar24 * fVar24 *
                     ((((fVar148 + (fVar24 * 0.00019875691 + 0.0013981999) * fVar24) * fVar24 +
                       0.041665796) * fVar24 + 0.16666666) * fVar24 + fVar73)) * auVar91._0_4_ +
                     fVar169;
                auVar126._20_4_ =
                     (fVar25 + fVar170 +
                     fVar25 * fVar25 *
                     ((((fVar149 + (fVar25 * 0.00019875691 + 0.0013981999) * fVar25) * fVar25 +
                       0.041665796) * fVar25 + 0.16666666) * fVar25 + fVar74)) * auVar91._4_4_ +
                     fVar170;
                auVar126._24_4_ =
                     (fVar26 + fVar171 +
                     fVar26 * fVar26 *
                     ((((fVar150 + (fVar26 * 0.00019875691 + 0.0013981999) * fVar26) * fVar26 +
                       0.041665796) * fVar26 + 0.16666666) * fVar26 + fVar89)) * auVar91._8_4_ +
                     fVar171;
                auVar126._28_4_ =
                     auVar88._28_4_ + fVar19 +
                     fVar151 + in_ZMM3._28_4_ + 0.0013981999 + 0.041665796 + 0.16666666 + fVar18 +
                     fVar19;
                auVar65._8_4_ = 0x800000;
                auVar65._0_8_ = 0x80000000800000;
                auVar65._12_4_ = 0x800000;
                auVar65._16_4_ = 0x800000;
                auVar65._20_4_ = 0x800000;
                auVar65._24_4_ = 0x800000;
                auVar65._28_4_ = 0x800000;
                auVar109 = vmaxps_avx(auVar126,auVar65);
                auVar91 = vpsrld_avx(auVar109._16_16_,0x17);
                auVar66._8_4_ = 0x807fffff;
                auVar66._0_8_ = 0x807fffff807fffff;
                auVar66._12_4_ = 0x807fffff;
                auVar66._16_4_ = 0x807fffff;
                auVar66._20_4_ = 0x807fffff;
                auVar66._24_4_ = 0x807fffff;
                auVar66._28_4_ = 0x807fffff;
                auVar127 = vandps_avx(auVar109,auVar66);
                auVar65 = vorps_avx(auVar127,auVar72._0_32_);
                auVar67._8_4_ = 0x3f3504f3;
                auVar67._0_8_ = 0x3f3504f33f3504f3;
                auVar67._12_4_ = 0x3f3504f3;
                auVar67._16_4_ = 0x3f3504f3;
                auVar67._20_4_ = 0x3f3504f3;
                auVar67._24_4_ = 0x3f3504f3;
                auVar67._28_4_ = 0x3f3504f3;
                auVar88 = vcmpps_avx(auVar67,auVar65,2);
                auVar127 = vandnps_avx(auVar88,auVar65);
                fVar160 = auVar65._0_4_ + -1.0 + auVar127._0_4_;
                fVar166 = auVar65._4_4_ + -1.0 + auVar127._4_4_;
                fVar167 = auVar65._8_4_ + -1.0 + auVar127._8_4_;
                fVar168 = auVar65._12_4_ + -1.0 + auVar127._12_4_;
                fVar169 = auVar65._16_4_ + -1.0 + auVar127._16_4_;
                fVar170 = auVar65._20_4_ + -1.0 + auVar127._20_4_;
                fVar171 = auVar65._24_4_ + -1.0 + auVar127._24_4_;
                auVar91 = vpsubd_avx(auVar91,auVar88._16_16_);
                auVar113 = vpsrld_avx(auVar109._0_16_,0x17);
                auVar137._8_4_ = 0xffffff81;
                auVar137._0_8_ = 0xffffff81ffffff81;
                auVar137._12_4_ = 0xffffff81;
                auVar91 = vpaddd_avx(auVar137,auVar91);
                auVar113 = vpsubd_avx(auVar113,auVar88._0_16_);
                auVar113 = vpaddd_avx(auVar137,auVar113);
                auVar85._16_16_ = auVar91;
                auVar85._0_16_ = auVar113;
                auVar140 = ZEXT864(0) << 0x20;
                auVar88 = vcmpps_avx(auVar126,_DAT_00539a40,2);
                auVar109 = vcvtdq2ps_avx(auVar85);
                auVar27._4_4_ =
                     (fVar166 + auVar109._4_4_ * 0.6931472 +
                     fVar166 * fVar166 *
                     (fVar166 * (fVar166 * (fVar166 * (fVar166 * (fVar166 * (fVar166 * (fVar166 * (
                                                  fVar166 * (fVar166 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._0_4_ =
                     (fVar160 + auVar109._0_4_ * 0.6931472 +
                     fVar160 * fVar160 *
                     (fVar160 * (fVar160 * (fVar160 * (fVar160 * (fVar160 * (fVar160 * (fVar160 * (
                                                  fVar160 * (fVar160 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._8_4_ =
                     (fVar167 + auVar109._8_4_ * 0.6931472 +
                     fVar167 * fVar167 *
                     (fVar167 * (fVar167 * (fVar167 * (fVar167 * (fVar167 * (fVar167 * (fVar167 * (
                                                  fVar167 * (fVar167 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._12_4_ =
                     (fVar168 + auVar109._12_4_ * 0.6931472 +
                     fVar168 * fVar168 *
                     (fVar168 * (fVar168 * (fVar168 * (fVar168 * (fVar168 * (fVar168 * (fVar168 * (
                                                  fVar168 * (fVar168 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._16_4_ =
                     (fVar169 + auVar109._16_4_ * 0.6931472 +
                     fVar169 * fVar169 *
                     (fVar169 * (fVar169 * (fVar169 * (fVar169 * (fVar169 * (fVar169 * (fVar169 * (
                                                  fVar169 * (fVar169 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._20_4_ =
                     (fVar170 + auVar109._20_4_ * 0.6931472 +
                     fVar170 * fVar170 *
                     (fVar170 * (fVar170 * (fVar170 * (fVar170 * (fVar170 * (fVar170 * (fVar170 * (
                                                  fVar170 * (fVar170 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._24_4_ =
                     (fVar171 + auVar109._24_4_ * 0.6931472 +
                     fVar171 * fVar171 *
                     (fVar171 * (fVar171 * (fVar171 * (fVar171 * (fVar171 * (fVar171 * (fVar171 * (
                                                  fVar171 * (fVar171 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._28_4_ = auVar65._28_4_ + -1.0 + auVar127._28_4_ + auVar109._28_4_ + 0.0;
                auVar104._8_4_ = 0x7fffffff;
                auVar104._0_8_ = 0x7fffffff7fffffff;
                auVar104._12_4_ = 0x7fffffff;
                auVar104._16_4_ = 0x7fffffff;
                auVar104._20_4_ = 0x7fffffff;
                auVar104._24_4_ = 0x7fffffff;
                auVar104._28_4_ = 0x7fffffff;
                auVar127 = vblendvps_avx(auVar27,auVar104,auVar88);
                auVar127 = vminps_avx(auVar139,auVar127);
                auVar141 = ZEXT3264(auVar107);
                auVar88 = vmaxps_avx(auVar107,auVar127);
                auVar142 = ZEXT3264(auVar142._0_32_);
                auVar105._0_4_ = fVar112 * auVar88._0_4_ + fVar62;
                auVar105._4_4_ = fVar131 * auVar88._4_4_ + fVar5;
                auVar105._8_4_ = fVar132 * auVar88._8_4_ + fVar16;
                auVar105._12_4_ = fVar133 * auVar88._12_4_ + fVar17;
                auVar105._16_4_ = fVar134 * auVar88._16_4_ + fVar73;
                auVar105._20_4_ = fVar135 * auVar88._20_4_ + fVar74;
                auVar105._24_4_ = fVar136 * auVar88._24_4_ + fVar89;
                auVar105._28_4_ = fVar18 + NAN;
                auVar109 = vroundps_avx(auVar105,1);
                auVar127 = vcmpps_avx(auVar105,auVar109,1);
                auVar111._8_4_ = 0x3f800000;
                auVar111._0_8_ = 0x3f8000003f800000;
                auVar111._12_4_ = 0x3f800000;
                auVar111._16_4_ = 0x3f800000;
                auVar111._20_4_ = 0x3f800000;
                auVar111._24_4_ = 0x3f800000;
                auVar111._28_4_ = 0x3f800000;
                auVar127 = vandps_avx(auVar127,auVar111);
                auVar65 = vsubps_avx(auVar109,auVar127);
                auVar28._4_4_ = auVar65._4_4_ * 0.6931472;
                auVar28._0_4_ = auVar65._0_4_ * 0.6931472;
                auVar28._8_4_ = auVar65._8_4_ * 0.6931472;
                auVar28._12_4_ = auVar65._12_4_ * 0.6931472;
                auVar28._16_4_ = auVar65._16_4_ * 0.6931472;
                auVar28._20_4_ = auVar65._20_4_ * 0.6931472;
                auVar28._24_4_ = auVar65._24_4_ * 0.6931472;
                auVar28._28_4_ = auVar109._28_4_;
                auVar88 = vsubps_avx(auVar88,auVar28);
                fVar160 = auVar88._0_4_;
                fVar166 = auVar88._4_4_;
                fVar167 = auVar88._8_4_;
                fVar168 = auVar88._12_4_;
                fVar169 = auVar88._16_4_;
                fVar170 = auVar88._20_4_;
                fVar171 = auVar88._24_4_;
                auVar144 = ZEXT3264(auVar144._0_32_);
                auVar72 = ZEXT3264(auVar72._0_32_);
                auVar127._0_4_ =
                     ((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + fVar143) * fVar160 +
                      0.041665796) * fVar160 + 0.16666666) * fVar160 + fVar62;
                auVar127._4_4_ =
                     ((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + fVar145) * fVar166 +
                      0.041665796) * fVar166 + 0.16666666) * fVar166 + fVar5;
                auVar127._8_4_ =
                     ((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + fVar146) * fVar167 +
                      0.041665796) * fVar167 + 0.16666666) * fVar167 + fVar16;
                auVar127._12_4_ =
                     ((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + fVar147) * fVar168 +
                      0.041665796) * fVar168 + 0.16666666) * fVar168 + fVar17;
                auVar127._16_4_ =
                     ((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + fVar148) * fVar169 +
                      0.041665796) * fVar169 + 0.16666666) * fVar169 + fVar73;
                auVar127._20_4_ =
                     ((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + fVar149) * fVar170 +
                      0.041665796) * fVar170 + 0.16666666) * fVar170 + fVar74;
                auVar127._24_4_ =
                     ((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + fVar150) * fVar171 +
                      0.041665796) * fVar171 + 0.16666666) * fVar171 + fVar89;
                auVar127._28_4_ = fVar151 + 0.6945454 + 0.041665796 + 0.16666666 + fVar18;
                auVar92._0_4_ = (int)auVar65._0_4_;
                auVar92._4_4_ = (int)auVar65._4_4_;
                auVar92._8_4_ = (int)auVar65._8_4_;
                auVar92._12_4_ = (int)auVar65._12_4_;
                auVar106._16_4_ = (int)auVar65._16_4_;
                auVar106._0_16_ = auVar92;
                auVar106._20_4_ = (int)auVar65._20_4_;
                auVar106._24_4_ = (int)auVar65._24_4_;
                auVar106._28_4_ = (int)auVar65._28_4_;
                auVar113 = vpslld_avx(auVar92,0x17);
                auVar91 = vpslld_avx(auVar106._16_16_,0x17);
                auVar64._8_4_ = 0x3f800000;
                auVar64._0_8_ = 0x3f8000003f800000;
                auVar64._12_4_ = 0x3f800000;
                auVar91 = vpaddd_avx(auVar91,auVar64);
                auVar113 = vpaddd_avx(auVar113,auVar64);
                auVar107._16_16_ = auVar91;
                auVar107._0_16_ = auVar113;
                auVar110 = ZEXT3264(CONCAT428(0x3f800000,
                                              CONCAT424(0x3f800000,
                                                        CONCAT420(0x3f800000,
                                                                  CONCAT416(0x3f800000,
                                                                            CONCAT412(0x3f800000,
                                                                                      CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                auVar86._0_4_ =
                     (fVar160 + 1.0 + fVar160 * fVar160 * auVar127._0_4_) * auVar113._0_4_ + 1.0;
                auVar86._4_4_ =
                     (fVar166 + 1.0 + fVar166 * fVar166 * auVar127._4_4_) * auVar113._4_4_ + 1.0;
                auVar86._8_4_ =
                     (fVar167 + 1.0 + fVar167 * fVar167 * auVar127._8_4_) * auVar113._8_4_ + 1.0;
                auVar86._12_4_ =
                     (fVar168 + 1.0 + fVar168 * fVar168 * auVar127._12_4_) * auVar113._12_4_ + 1.0;
                auVar86._16_4_ =
                     (fVar169 + 1.0 + fVar169 * fVar169 * auVar127._16_4_) * auVar91._0_4_ + 1.0;
                auVar86._20_4_ =
                     (fVar170 + 1.0 + fVar170 * fVar170 * auVar127._20_4_) * auVar91._4_4_ + 1.0;
                auVar86._24_4_ =
                     (fVar171 + 1.0 + fVar171 * fVar171 * auVar127._24_4_) * auVar91._8_4_ + 1.0;
                auVar86._28_4_ = auVar88._28_4_ + 1.0 + auVar109._28_4_ + 1.0;
                auVar68._8_4_ = 0x40000000;
                auVar68._0_8_ = 0x4000000040000000;
                auVar68._12_4_ = 0x40000000;
                auVar68._16_4_ = 0x40000000;
                auVar68._20_4_ = 0x40000000;
                auVar68._24_4_ = 0x40000000;
                auVar68._28_4_ = 0x40000000;
                auVar88 = vdivps_avx(auVar68,auVar86);
                auVar84._0_4_ = auVar88._0_4_ + -1.0;
                auVar84._4_4_ = auVar88._4_4_ + -1.0;
                auVar84._8_4_ = auVar88._8_4_ + -1.0;
                auVar84._12_4_ = auVar88._12_4_ + -1.0;
                auVar84._16_4_ = auVar88._16_4_ + -1.0;
                auVar84._20_4_ = auVar88._20_4_ + -1.0;
                auVar84._24_4_ = auVar88._24_4_ + -1.0;
                goto LAB_003eec39;
              case 6:
                pfVar1 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                fVar160 = *pfVar1;
                fVar62 = pfVar1[1];
                auVar107._4_4_ = fVar62;
                auVar107._0_4_ = fVar62;
                auVar107._8_4_ = fVar62;
                auVar107._12_4_ = fVar62;
                auVar107._16_4_ = fVar62;
                auVar107._20_4_ = fVar62;
                auVar107._24_4_ = fVar62;
                auVar107._28_4_ = fVar62;
                auVar88._0_4_ = auVar154._0_4_ * fVar160 + fVar62;
                auVar88._4_4_ = auVar154._4_4_ * fVar160 + fVar62;
                auVar88._8_4_ = fVar155 * fVar160 + fVar62;
                auVar88._12_4_ = fVar156 * fVar160 + fVar62;
                auVar88._16_4_ = fVar157 * fVar160 + fVar62;
                auVar88._20_4_ = fVar158 * fVar160 + fVar62;
                auVar88._24_4_ = fVar159 * fVar160 + fVar62;
                auVar88._28_4_ = fVar160 + fVar62;
                auVar88 = vmaxps_avx(auVar65,auVar88);
                auVar88 = vminps_avx(auVar88,auVar109);
                auVar84 = auVar88._0_28_;
LAB_003eec39:
                in_ZMM3 = ZEXT3264(auVar107);
                auVar30._4_4_ = auVar154._4_4_ * auVar84._4_4_;
                auVar30._0_4_ = auVar154._0_4_ * auVar84._0_4_;
                auVar30._8_4_ = fVar155 * auVar84._8_4_;
                auVar30._12_4_ = fVar156 * auVar84._12_4_;
                auVar30._16_4_ = fVar157 * auVar84._16_4_;
                auVar30._20_4_ = fVar158 * auVar84._20_4_;
                auVar30._24_4_ = fVar159 * auVar84._24_4_;
                auVar30._28_4_ = auVar127._28_4_;
                auVar127 = auVar30;
              }
switchD_003ee7d7_caseD_1:
              *pauVar51 = auVar127;
              pauVar51 = pauVar51 + 1;
              iVar4 = iVar4 + 1;
            }
          }
          iVar39 = iVar39 + iVar35 * 8;
        }
      }
    }
    else {
      uVar46 = (long)(int)(iVar39 * uVar60) / (long)iVar11;
      uVar43 = (long)iVar35 / (long)iVar11;
      if (opt->use_packing_layout == true) {
        uVar60 = (uint)((uVar46 & 3) == 0) * 3 + 1;
        if ((uVar46 & 7) == 0) {
          uVar60 = 8;
        }
        _elempack = (uint)((uVar43 & 3) == 0) * 3 + 1;
        if ((uVar43 & 7) == 0) {
          _elempack = 8;
        }
      }
      else {
        uVar60 = 1;
        _elempack = uVar60;
      }
      piVar12 = bottom_blob->refcount;
      local_178.data = bottom_blob->data;
      local_178.refcount = bottom_blob->refcount;
      local_178.elemsize = bottom_blob->elemsize;
      local_178.elempack = bottom_blob->elempack;
      local_178.allocator = bottom_blob->allocator;
      local_178.dims = bottom_blob->dims;
      local_178.w = bottom_blob->w;
      local_178.h = bottom_blob->h;
      local_178.d = bottom_blob->d;
      local_178.c = bottom_blob->c;
      local_178.cstep = bottom_blob->cstep;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      local_288 = uVar46 & 0xffffffff;
      uVar57 = local_288;
      local_2b8 = uVar43 & 0xffffffff;
      uVar52 = uVar43;
      if ((int)uVar60 < iVar39) {
        opt_p.lightmode = opt->lightmode;
        opt_p.use_shader_pack8 = opt->use_shader_pack8;
        opt_p.use_subgroup_ops = opt->use_subgroup_ops;
        opt_p.use_reserved_0 = opt->use_reserved_0;
        opt_p.num_threads = opt->num_threads;
        opt_p.workspace_allocator = opt->workspace_allocator;
        opt_p.openmp_blocktime = opt->openmp_blocktime;
        opt_p.use_winograd_convolution = opt->use_winograd_convolution;
        opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_p.use_int8_inference = opt->use_int8_inference;
        opt_p.use_vulkan_compute = opt->use_vulkan_compute;
        opt_p.use_bf16_storage = opt->use_bf16_storage;
        opt_p.use_fp16_packed = opt->use_fp16_packed;
        opt_p.use_fp16_storage = opt->use_fp16_storage;
        opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_p.use_int8_packed = opt->use_int8_packed;
        opt_p.use_int8_storage = opt->use_int8_storage;
        opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_p.use_packing_layout = opt->use_packing_layout;
        opt_p.vulkan_device_index = opt->vulkan_device_index;
        opt_p.use_reserved_1 = opt->use_reserved_1;
        opt_p.use_image_storage = opt->use_image_storage;
        opt_p.use_tensor_storage = opt->use_tensor_storage;
        opt_p.use_reserved_2 = opt->use_reserved_2;
        opt_p.flush_denormals = opt->flush_denormals;
        opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_p.use_shader_local_memory = opt->use_shader_local_memory;
        opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_p.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_p.use_fp16_uniform = opt->use_fp16_uniform;
        opt_p.use_int8_uniform = opt->use_int8_uniform;
        opt_p.use_reserved_9 = opt->use_reserved_9;
        opt_p.use_reserved_10 = opt->use_reserved_10;
        opt_p.use_reserved_11 = opt->use_reserved_11;
        opt_p.blob_allocator = opt->workspace_allocator;
        convert_packing(bottom_blob,&local_178,uVar60,&opt_p);
        if (local_178.data == (void *)0x0) {
          iVar40 = -100;
          bVar29 = false;
        }
        else {
          uVar52 = uVar43 & 0xffffffff;
          if ((long)local_178.c * local_178.cstep != 0) goto LAB_003eedc6;
          bVar29 = false;
          iVar40 = -100;
        }
      }
      else {
LAB_003eedc6:
        sVar31 = local_228.cstep;
        piVar12 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        opt_p.blob_allocator =
             (Allocator *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        opt_p._0_8_ = local_228.data;
        opt_p.workspace_allocator = (Allocator *)local_228.elemsize;
        opt_p.openmp_blocktime = local_228.elempack;
        opt_p._32_8_ = local_228.allocator;
        opt_p._44_4_ = local_228.w;
        opt_p.vulkan_device_index = local_228.dims;
        opt_p._48_8_ = local_228._48_8_;
        opt_p.use_winograd43_convolution = (bool)(undefined1)local_228.c;
        opt_p.use_winograd63_convolution = (bool)local_228.c._1_1_;
        opt_p.use_a53_a55_optimized_kernel = (bool)local_228.c._2_1_;
        opt_p.use_fp16_uniform = (bool)local_228.c._3_1_;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
        }
        if (_elempack < uVar47) {
          Mat::create((Mat *)&opt_p,iVar49,iVar54,
                      (this->super_DeconvolutionDepthWise).num_output / (int)_elempack,
                      (ulong)_elempack * (sVar55 / uVar47),_elempack,opt->workspace_allocator);
          if (opt_p._0_8_ != 0) {
            uVar52 = uVar43 & 0xffffffff;
            if ((long)(int)opt_p._56_4_ * sVar31 != 0) goto LAB_003eeec1;
          }
LAB_003efca5:
          iVar40 = -100;
          bVar29 = false;
        }
        else {
LAB_003eeec1:
          iVar39 = 0;
          iVar48 = 0;
          lVar58 = 0;
          uVar61 = uVar46;
          do {
            if ((this->super_DeconvolutionDepthWise).group <= lVar58) {
              if (_elempack < uVar47) {
                convert_packing((Mat *)&opt_p,&local_228,uVar47,opt);
                if ((local_228.data == (void *)0x0) || ((long)local_228.c * local_228.cstep == 0))
                goto LAB_003efca5;
              }
              else {
                if (opt_p.blob_allocator != (Allocator *)0x0) {
                  LOCK();
                  *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
                       *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
                  UNLOCK();
                }
                piVar12 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
                if (piVar12 != (int *)0x0) {
                  LOCK();
                  *piVar12 = *piVar12 + -1;
                  UNLOCK();
                  if (*piVar12 == 0) {
                    if (local_228.allocator == (Allocator *)0x0) {
                      free(local_228.data);
                    }
                    else {
                      (*(local_228.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                uVar33 = opt_p._56_8_;
                local_228.data = (void *)opt_p._0_8_;
                local_228.refcount._0_4_ = SUB84(opt_p.blob_allocator,0);
                local_228.refcount._4_4_ = (undefined4)((ulong)opt_p.blob_allocator >> 0x20);
                local_228.elemsize = (size_t)opt_p.workspace_allocator;
                local_228.elempack = opt_p.openmp_blocktime;
                local_228.allocator = (Allocator *)opt_p._32_8_;
                local_228.dims = opt_p.vulkan_device_index;
                local_228.w = opt_p._44_4_;
                local_228._48_8_ = opt_p._48_8_;
                local_228.c._0_1_ = opt_p.use_winograd43_convolution;
                local_228.c._1_1_ = opt_p.use_winograd63_convolution;
                local_228.c._2_1_ = opt_p.use_a53_a55_optimized_kernel;
                local_228.c._3_1_ = opt_p.use_fp16_uniform;
                local_228.cstep = sVar31;
                opt_p._56_8_ = uVar33;
              }
              iVar40 = -100;
              bVar29 = true;
              goto LAB_003efd86;
            }
            m.c = (int)uVar61 / (int)uVar60;
            m.data = (void *)((long)(iVar39 / (int)uVar60) * local_178.cstep * local_178.elemsize +
                             (long)local_178.data);
            m.refcount = (int *)0x0;
            m.elemsize = local_178.elemsize;
            m.elempack = local_178.elempack;
            m.allocator = local_178.allocator;
            m.cstep = ((long)local_178.d * local_178.elemsize *
                       (long)local_178.h * (long)local_178.w + 0xf & 0xfffffffffffffff0) /
                      local_178.elemsize;
            m.dims = local_178.dims;
            m.w = local_178.w;
            m.h = local_178.h;
            m.d = local_178.d;
            m_1.c = (int)uVar52 / (int)_elempack;
            m_1.data = (void *)((long)(iVar48 / (int)_elempack) * sVar31 *
                                (long)opt_p.workspace_allocator + opt_p._0_8_);
            m_1.refcount = (int *)0x0;
            m_1.elemsize = (size_t)opt_p.workspace_allocator;
            m_1.elempack = opt_p.openmp_blocktime;
            m_1.allocator = (Allocator *)opt_p._32_8_;
            m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                         (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU &
                        0xfffffffffffffff0) / (ulong)opt_p.workspace_allocator;
            m_1._40_8_ = opt_p._40_8_;
            m_1._48_8_ = opt_p._48_8_;
            pLVar14 = (this->group_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar58];
            opt_g.lightmode = opt->lightmode;
            opt_g.use_shader_pack8 = opt->use_shader_pack8;
            opt_g.use_subgroup_ops = opt->use_subgroup_ops;
            opt_g.use_reserved_0 = opt->use_reserved_0;
            opt_g.num_threads = opt->num_threads;
            opt_g.workspace_allocator = opt->workspace_allocator;
            opt_g.openmp_blocktime = opt->openmp_blocktime;
            opt_g.use_winograd_convolution = opt->use_winograd_convolution;
            opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
            opt_g.use_int8_inference = opt->use_int8_inference;
            opt_g.use_vulkan_compute = opt->use_vulkan_compute;
            opt_g.use_bf16_storage = opt->use_bf16_storage;
            opt_g.use_fp16_packed = opt->use_fp16_packed;
            opt_g.use_fp16_storage = opt->use_fp16_storage;
            opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
            opt_g.use_int8_packed = opt->use_int8_packed;
            opt_g.use_int8_storage = opt->use_int8_storage;
            opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
            opt_g.use_packing_layout = opt->use_packing_layout;
            opt_g.vulkan_device_index = opt->vulkan_device_index;
            opt_g.use_reserved_1 = opt->use_reserved_1;
            opt_g.use_image_storage = opt->use_image_storage;
            opt_g.use_tensor_storage = opt->use_tensor_storage;
            opt_g.use_reserved_2 = opt->use_reserved_2;
            opt_g.flush_denormals = opt->flush_denormals;
            opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
            opt_g.use_shader_local_memory = opt->use_shader_local_memory;
            opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
            opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
            opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
            opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
            opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
            opt_g.use_fp16_uniform = opt->use_fp16_uniform;
            opt_g.use_int8_uniform = opt->use_int8_uniform;
            opt_g.use_reserved_9 = opt->use_reserved_9;
            opt_g.use_reserved_10 = opt->use_reserved_10;
            opt_g.use_reserved_11 = opt->use_reserved_11;
            opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
            iVar40 = (*pLVar14->_vptr_Layer[7])(pLVar14,&m,&m_1,&opt_g);
            local_288._0_4_ = (int)uVar46;
            if (m_1.refcount != (int *)0x0) {
              LOCK();
              *m_1.refcount = *m_1.refcount + -1;
              UNLOCK();
              if (*m_1.refcount == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  free(m_1.data);
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            if (m.refcount != (int *)0x0) {
              LOCK();
              *m.refcount = *m.refcount + -1;
              UNLOCK();
              if (*m.refcount == 0) {
                if (m.allocator == (Allocator *)0x0) {
                  free(m.data);
                }
                else {
                  (*(m.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            lVar58 = lVar58 + 1;
            iVar48 = iVar48 + (int)uVar43;
            iVar39 = iVar39 + (int)local_288;
            uVar61 = uVar57;
            uVar52 = local_2b8;
          } while (iVar40 == 0);
          bVar29 = false;
        }
LAB_003efd86:
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_p._32_8_ == 0) {
              free((void *)opt_p._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
            }
          }
        }
      }
      if (local_178.refcount != (int *)0x0) {
        LOCK();
        *local_178.refcount = *local_178.refcount + -1;
        UNLOCK();
        if (*local_178.refcount == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            free(local_178.data);
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar29) goto LAB_003efe3d;
    }
    pMVar32 = local_1d0;
    DeconvolutionDepthWise::cut_padding
              (&this->super_DeconvolutionDepthWise,&local_228,local_1d0,opt);
    if ((pMVar32->data != (void *)0x0) && (iVar40 = 0, (long)local_1d0->c * local_1d0->cstep != 0))
    goto LAB_003efe3d;
  }
  iVar40 = -100;
LAB_003efe3d:
  piVar12 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        free(local_228.data);
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar40;
}

Assistant:

int DeconvolutionDepthWise_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            int ret = op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
            if (ret != 0)
                return ret;
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
            if (top_blob_bordered.empty())
                return -100;
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}